

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::fboc::details::TestBase::iterate(TestBase *this)

{
  FormatDB *db;
  char **value;
  ostringstream *poVar1;
  Context *pCVar2;
  bool bVar3;
  int iVar4;
  IterateResult IVar5;
  _Rb_tree_color fboStatus;
  undefined4 extraout_var;
  _Base_ptr p_Var6;
  MessageBuilder *pMVar7;
  undefined4 extraout_var_00;
  Enum<int,_2UL> *value_00;
  FormatFlags feature;
  FormatFlags feature_00;
  char *msg_00;
  MessageBuilder *in_R8;
  long lVar8;
  allocator<char> local_371;
  FormatDB *local_370;
  TestLog *local_368;
  _Rb_tree_color local_35c;
  FormatDB *local_358;
  FormatDB *local_350;
  ScopedLogSection section;
  ScopedLogSection supersection;
  set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  formats;
  string local_2f0;
  ValidStatusCodes reference;
  MessageBuilder msg;
  Framebuffer fbo;
  FboBuilder builder;
  
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&fbo,this->m_ctx->m_renderCtx);
  iVar4 = (*this->m_ctx->m_renderCtx->_vptr_RenderContext[3])();
  FboUtil::FboBuilder::FboBuilder
            (&builder,fbo.super_ObjectWrapper.m_object,0x8d40,
             (Functions *)CONCAT44(extraout_var,iVar4));
  IVar5 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,&builder);
  FboUtil::FboVerifier::validStatusCodes
            (&reference,&this->m_ctx->m_verifier,&builder.super_Framebuffer);
  local_35c = builder.m_error;
  FboUtil::logFramebufferConfig
            (&builder.super_Framebuffer,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  pCVar2 = this->m_ctx;
  local_358 = &pCVar2->m_ctxFormats;
  local_350 = &pCVar2->m_coreFormats;
  local_368 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  formats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &formats._M_t._M_impl.super__Rb_tree_header._M_header;
  formats._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  formats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  formats._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_370 = &pCVar2->m_allFormats;
  formats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       formats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var6 = builder.super_Framebuffer.textures._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var6 !=
      &builder.super_Framebuffer.textures._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    std::
    _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
    ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
              ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
                *)&formats,(ImageFormat *)&(p_Var6[1]._M_parent)->_M_parent);
  }
  for (p_Var6 = builder.super_Framebuffer.rbos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 !=
      &builder.super_Framebuffer.rbos._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    std::
    _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
    ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
              ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
                *)&formats,(ImageFormat *)&(p_Var6[1]._M_parent)->_M_parent);
  }
  if (formats._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"Format",(allocator<char> *)&section);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"Format info",&local_371);
    tcu::ScopedLogSection::ScopedLogSection(&supersection,local_368,(string *)&msg,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&msg);
    p_Var6 = formats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      poVar1 = &msg.m_str;
      if ((_Rb_tree_header *)p_Var6 == &formats._M_t._M_impl.super__Rb_tree_header) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&msg,"FormatInfo",&local_371);
      db = (FormatDB *)(p_Var6 + 1);
      de::toString<deqp::gls::FboUtil::ImageFormat>(&local_2f0,(ImageFormat *)db);
      tcu::ScopedLogSection::ScopedLogSection(&section,local_368,(string *)&msg,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&msg);
      bVar3 = isFormatFeatureSupported(local_358,(ImageFormat *)db,TEXTURE_VALID);
      if (bVar3) {
        msg.m_log = local_368;
        poVar1 = &msg.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "* Valid texture format\n");
        bVar3 = isFormatFeatureSupported(local_350,(ImageFormat *)db,TEXTURE_VALID);
        if (bVar3) {
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t* core feature");
        }
        else {
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t* defined in supported extension(s):\n");
          logAffectingExtensions((char *)local_358,db,(ImageFormat *)0x10,(FormatFlags)&msg,in_R8);
        }
        tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        msg.m_log = local_368;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "* Unsupported texture format\n");
        bVar3 = isFormatFeatureSupported(local_370,(ImageFormat *)db,TEXTURE_VALID);
        if (bVar3) {
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t* requires any of the extensions or combinations:\n");
          logAffectingExtensions((char *)local_370,db,(ImageFormat *)0x10,(FormatFlags)&msg,in_R8);
        }
        else {
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t* no extension can make this format valid");
        }
        tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg.m_str);
      bVar3 = isFormatFeatureSupported(local_358,(ImageFormat *)db,RENDERBUFFER_VALID);
      if (bVar3) {
        msg.m_log = local_368;
        poVar1 = &msg.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "* Valid renderbuffer format\n");
        bVar3 = isFormatFeatureSupported(local_350,(ImageFormat *)db,RENDERBUFFER_VALID);
        if (bVar3) {
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t* core feature");
        }
        else {
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t* defined in supported extension(s):\n");
          logAffectingExtensions((char *)local_358,db,(ImageFormat *)0x8,(FormatFlags)&msg,in_R8);
        }
        tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        msg.m_log = local_368;
        poVar1 = &msg.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "* Unsupported renderbuffer format\n");
        bVar3 = isFormatFeatureSupported(local_370,(ImageFormat *)db,RENDERBUFFER_VALID);
        if (bVar3) {
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t* requires any of the extensions or combinations:\n");
          logAffectingExtensions((char *)local_370,db,(ImageFormat *)0x8,(FormatFlags)&msg,in_R8);
        }
        else {
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t* no extension can make this format valid");
        }
        tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg.m_str);
      for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
        feature_00 = *(FormatFlags *)
                      (logFormatInfo(deqp::gls::FboUtil::config::Framebuffer_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,tcu::TestLog&)
                       ::s_renderability + lVar8 + 8);
        feature = feature_00 | REQUIRED_RENDERABLE;
        bVar3 = isFormatFeatureSupported(local_358,(ImageFormat *)db,feature);
        value = (char **)(logFormatInfo(deqp::gls::FboUtil::config::Framebuffer_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,deqp::gls::FboUtil::FormatDB_const&,tcu::TestLog&)
                          ::s_renderability + lVar8);
        if (bVar3) {
          msg.m_log = local_368;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg.m_str);
          std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                          "* Format is ");
          pMVar7 = tcu::MessageBuilder::operator<<(&msg,value);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          bVar3 = isFormatFeatureSupported(local_350,(ImageFormat *)db,feature);
          if (bVar3) {
            std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                            "\t* core feature");
          }
          else {
            std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                            "\t* defined in supported extension(s):\n");
            logAffectingExtensions
                      ((char *)local_358,db,(ImageFormat *)(ulong)feature,(FormatFlags)&msg,in_R8);
          }
          tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          bVar3 = isFormatFeatureSupported(local_358,(ImageFormat *)db,feature_00);
          if (bVar3) {
            msg.m_log = local_368;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg.m_str);
            std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                            "* Format is allowed to be ");
            pMVar7 = tcu::MessageBuilder::operator<<(&msg,value);
            std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            " but not required\n");
            bVar3 = isFormatFeatureSupported(local_350,(ImageFormat *)db,feature_00);
            if (bVar3) {
              std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                              "\t* core feature");
            }
            else {
              bVar3 = isFormatFeatureSupported(local_370,(ImageFormat *)db,feature_00);
              if (bVar3) {
                std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\t* extensions that would make format ");
                pMVar7 = tcu::MessageBuilder::operator<<(&msg,value);
                std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                                ":\n");
                logAffectingExtensions
                          ((char *)local_370,db,(ImageFormat *)(ulong)feature_00,(FormatFlags)&msg,
                           in_R8);
              }
              else {
                std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\t* no extension can make this format ");
                tcu::MessageBuilder::operator<<(&msg,value);
              }
            }
            tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            msg.m_log = local_368;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg.m_str);
            std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                            "* Format is NOT ");
            pMVar7 = tcu::MessageBuilder::operator<<(&msg,value);
            std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n"
                           );
            bVar3 = isFormatFeatureSupported(local_370,(ImageFormat *)db,feature_00);
            if (bVar3) {
              bVar3 = isFormatFeatureSupported(local_370,(ImageFormat *)db,feature);
              if (bVar3) {
                std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\t* extensions that would make format ");
                pMVar7 = tcu::MessageBuilder::operator<<(&msg,value);
                std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                                ":\n");
                feature_00 = feature;
              }
              else {
                std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\t* extensions that are allowed to make format ");
                pMVar7 = tcu::MessageBuilder::operator<<(&msg,value);
                std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                                ":\n");
              }
              logAffectingExtensions
                        ((char *)local_370,db,(ImageFormat *)(ulong)feature_00,(FormatFlags)&msg,
                         in_R8);
            }
            else {
              std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                              "\t* no extension can make this format ");
              tcu::MessageBuilder::operator<<(&msg,value);
            }
            tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg.m_str);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&supersection);
  }
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~_Rb_tree(&formats._M_t);
  FboUtil::ValidStatusCodes::logRules
            (&reference,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  FboUtil::ValidStatusCodes::logLegalResults
            (&reference,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  if (local_35c == _S_red) {
    iVar4 = (*this->m_ctx->m_renderCtx->_vptr_RenderContext[3])();
    fboStatus = (**(code **)(CONCAT44(extraout_var_00,iVar4) + 0x170))(0x8d40);
    bVar3 = FboUtil::ValidStatusCodes::isFBOStatusValid(&reference,fboStatus);
    msg.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = &msg.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Received ");
    formats._M_t._M_impl._0_8_ = glu::getFramebufferStatusName;
    formats._M_t._M_impl.super__Rb_tree_header._M_header._M_color = fboStatus;
    tcu::Format::Enum<int,_2UL>::toStream
              ((Enum<int,_2UL> *)&formats,
               &poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
    tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    if (bVar3) {
      if (fboStatus != 0x8cd5) {
        bVar3 = FboUtil::ValidStatusCodes::isFBOStatusValid(&reference,0x8cd5);
        if (bVar3) {
          qualityWarning(this,"Framebuffer object could have checked as complete but did not.");
          goto LAB_014acca6;
        }
      }
      pass(this);
    }
    else {
      if (fboStatus == 0x8cd5) {
        msg_00 = "Framebuffer checked as complete, expected incomplete";
      }
      else {
        bVar3 = FboUtil::ValidStatusCodes::isFBOStatusRequired(&reference,0x8cd5);
        msg_00 = "Framebuffer checked as incomplete, but with wrong status";
        if (bVar3) {
          msg_00 = "Framebuffer checked is incomplete, expected complete";
        }
      }
      fail(this,msg_00);
    }
  }
  else {
    msg.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = &msg.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Received ");
    formats._M_t._M_impl._0_8_ = glu::getErrorName;
    formats._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_35c;
    tcu::Format::Enum<int,_2UL>::toStream
              ((Enum<int,_2UL> *)&formats,
               &poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    " (during FBO initialization).");
    tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    bVar3 = FboUtil::ValidStatusCodes::isErrorCodeValid(&reference,local_35c);
    if (bVar3) {
      pass(this);
    }
    else {
      bVar3 = FboUtil::ValidStatusCodes::isErrorCodeRequired(&reference,0);
      if (bVar3) {
        local_2f0._M_dataplus._M_p = (pointer)glu::getErrorName;
        local_2f0._M_string_length._0_4_ = local_35c;
        de::toString<tcu::Format::Enum<int,2ul>>((string *)&formats,(de *)&local_2f0,value_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                       "Expected no error but got ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&formats
                      );
        fail(this,(char *)msg.m_log);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::~string((string *)&formats);
      }
      else {
        fail(this,"Got wrong error code");
      }
    }
  }
LAB_014acca6:
  FboUtil::ValidStatusCodes::~ValidStatusCodes(&reference);
  FboUtil::FboBuilder::~FboBuilder(&builder);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  return IVar5;
}

Assistant:

IterateResult TestBase::iterate (void)
{
	glu::Framebuffer		fbo			(m_ctx.getRenderContext());
	FboBuilder				builder		(*fbo, GL_FRAMEBUFFER, gl(*this));
	const IterateResult		ret			= build(builder);
	const ValidStatusCodes	reference	= m_ctx.getVerifier().validStatusCodes(builder);
	const GLenum			errorCode	= builder.getError();

	logFramebufferConfig(builder, m_testCtx.getLog());
	logFormatInfo(builder, m_ctx.getCtxFormats(), m_ctx.getCoreFormats(), m_ctx.getAllFormats(), m_testCtx.getLog());
	reference.logRules(m_testCtx.getLog());
	reference.logLegalResults(m_testCtx.getLog());

	// \todo [2013-12-04 lauri] Check if drawing operations succeed.

	if (errorCode != GL_NO_ERROR)
	{
		m_testCtx.getLog()
			<< TestLog::Message
			<< "Received " << glu::getErrorStr(errorCode) << " (during FBO initialization)."
			<< TestLog::EndMessage;

		if (reference.isErrorCodeValid(errorCode))
			pass();
		else if (reference.isErrorCodeRequired(GL_NO_ERROR))
			fail(("Expected no error but got " + de::toString(glu::getErrorStr(errorCode))).c_str());
		else
			fail("Got wrong error code");
	}
	else
	{
		const GLenum	fboStatus	= gl(*this).checkFramebufferStatus(GL_FRAMEBUFFER);
		const bool		validStatus	= reference.isFBOStatusValid(fboStatus);

		m_testCtx.getLog()
			<< TestLog::Message
			<< "Received " << glu::getFramebufferStatusStr(fboStatus) << "."
			<< TestLog::EndMessage;

		if (!validStatus)
		{
			if (fboStatus == GL_FRAMEBUFFER_COMPLETE)
				fail("Framebuffer checked as complete, expected incomplete");
			else if (reference.isFBOStatusRequired(GL_FRAMEBUFFER_COMPLETE))
				fail("Framebuffer checked is incomplete, expected complete");
			else
				// An incomplete status is allowed, but not _this_ incomplete status.
				fail("Framebuffer checked as incomplete, but with wrong status");
		}
		else if (fboStatus != GL_FRAMEBUFFER_COMPLETE && reference.isFBOStatusValid(GL_FRAMEBUFFER_COMPLETE))
			qualityWarning("Framebuffer object could have checked as complete but did not.");
		else
			pass();
	}

	return ret;
}